

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_dynlight.cpp
# Opt level: O1

void gl_ParsePulseLight(FScanner *sc)

{
  bool bVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  FLightDefaults *defaults;
  int i;
  long lVar5;
  float floatTriple [3];
  float local_44 [3];
  double *local_38;
  
  FScanner::GetString(sc);
  iVar3 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
  FScanner::GetString(sc);
  bVar1 = FScanner::Compare(sc,"{");
  if (bVar1) {
    defaults = (FLightDefaults *)operator_new(0x38);
    (defaults->m_Name).Index = iVar3;
    defaults->m_type = PulseLight;
    defaults->m_subtractive = false;
    defaults->m_additive = false;
    defaults->m_halo = false;
    defaults->m_dontlightself = false;
    defaults->m_Args[0] = '\0';
    defaults->m_Args[1] = '\0';
    defaults->m_Args[2] = '\0';
    defaults->m_Args[3] = '\0';
    defaults->m_Args[4] = '\0';
    defaults->m_Param = 0.0;
    (defaults->m_Pos).X = 0.0;
    (defaults->m_Pos).Y = 0.0;
    (defaults->m_Pos).Z = 0.0;
    ScriptDepth = ScriptDepth + 1;
    if (ScriptDepth != 0) {
      local_38 = &defaults->m_Param;
      do {
        FScanner::GetString(sc);
        iVar3 = FScanner::MatchString(sc,LightTags,8);
        switch(iVar3) {
        case 0:
          lVar5 = 0;
          do {
            FScanner::GetFloat(sc);
            local_44[lVar5] = (float)sc->Float;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          iVar3 = (int)(local_44[0] * 255.0);
          if (0xfe < iVar3) {
            iVar3 = 0xff;
          }
          uVar2 = (uchar)iVar3;
          if (iVar3 < 1) {
            uVar2 = '\0';
          }
          iVar3 = (int)(local_44[1] * 255.0);
          if (0xfe < (int)(local_44[1] * 255.0)) {
            iVar3 = 0xff;
          }
          defaults->m_Args[0] = uVar2;
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          iVar4 = (int)(local_44[2] * 255.0);
          defaults->m_Args[1] = (uchar)iVar3;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          uVar2 = (uchar)iVar4;
          if (iVar4 < 1) {
            uVar2 = '\0';
          }
          defaults->m_Args[2] = uVar2;
          break;
        case 1:
          FScanner::GetNumber(sc);
          iVar3 = sc->Number;
          if (0xfe < iVar3) {
            iVar3 = 0xff;
          }
          uVar2 = (uchar)iVar3;
          if (iVar3 < 1) {
            uVar2 = '\0';
          }
          defaults->m_Args[3] = uVar2;
          break;
        case 2:
          FScanner::GetNumber(sc);
          iVar3 = sc->Number;
          if (0xfe < iVar3) {
            iVar3 = 0xff;
          }
          uVar2 = (uchar)iVar3;
          if (iVar3 < 1) {
            uVar2 = '\0';
          }
          defaults->m_Args[4] = uVar2;
          break;
        case 3:
          lVar5 = 0;
          do {
            FScanner::GetFloat(sc);
            local_44[lVar5] = (float)sc->Float;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          (defaults->m_Pos).X = (double)local_44[0];
          (defaults->m_Pos).Z = (double)local_44[1];
          (defaults->m_Pos).Y = (double)local_44[2];
          break;
        default:
          FScanner::ScriptError(sc,"Unknown tag: %s\n",sc->String);
          break;
        case 5:
          FScanner::GetFloat(sc);
          *local_38 = (double)((float)sc->Float * 35.0);
          break;
        case 9:
          ScriptDepth = ScriptDepth + 1;
          break;
        case 10:
          ScriptDepth = ScriptDepth + -1;
          break;
        case 0xb:
          FScanner::GetNumber(sc);
          defaults->m_subtractive = sc->Number != 0;
          break;
        case 0xd:
          FScanner::GetNumber(sc);
          defaults->m_halo = sc->Number != 0;
          break;
        case 0xe:
          FScanner::GetNumber(sc);
          defaults->m_dontlightself = sc->Number != 0;
        }
      } while (ScriptDepth != 0);
    }
    gl_AddLightDefaults(defaults);
    return;
  }
  FScanner::ScriptError(sc,"Expected \'{\'.\n");
  return;
}

Assistant:

void gl_ParsePulseLight(FScanner &sc)
{
	int type;
	float floatVal, floatTriple[3];
	int intVal;
	FLightDefaults *defaults;

	// get name
	sc.GetString();
	FName name = sc.String;

	// check for opening brace
	sc.GetString();
	if (sc.Compare("{"))
	{
		defaults = new FLightDefaults(name, PulseLight);
		ScriptDepth++;
		while (ScriptDepth)
		{
			sc.GetString();
			type = sc.MatchString(LightTags);
			switch (type)
			{
			case LIGHTTAG_OPENBRACE:
				ScriptDepth++;
				break;
			case LIGHTTAG_CLOSEBRACE:
				ScriptDepth--;
				break;
			case LIGHTTAG_COLOR:
				gl_ParseTriple(sc, floatTriple);
				defaults->SetArg(LIGHT_RED, clamp<int>((int)(floatTriple[0] * 255), 0, 255));
				defaults->SetArg(LIGHT_GREEN, clamp<int>((int)(floatTriple[1] * 255), 0, 255));
				defaults->SetArg(LIGHT_BLUE, clamp<int>((int)(floatTriple[2] * 255), 0, 255));
				break;
			case LIGHTTAG_OFFSET:
				gl_ParseTriple(sc, floatTriple);
				defaults->SetOffset(floatTriple);
				break;
			case LIGHTTAG_SIZE:
				intVal = clamp<int>(gl_ParseInt(sc), 0, 255);
				defaults->SetArg(LIGHT_INTENSITY, intVal);
				break;
			case LIGHTTAG_SECSIZE:
				intVal = clamp<int>(gl_ParseInt(sc), 0, 255);
				defaults->SetArg(LIGHT_SECONDARY_INTENSITY, intVal);
				break;
			case LIGHTTAG_INTERVAL:
				floatVal = gl_ParseFloat(sc);
				defaults->SetParameter(floatVal * TICRATE);
				break;
			case LIGHTTAG_SUBTRACTIVE:
				defaults->SetSubtractive(gl_ParseInt(sc) != 0);
				break;
			case LIGHTTAG_HALO:
				defaults->SetHalo(gl_ParseInt(sc) != 0);
				break;
			case LIGHTTAG_DONTLIGHTSELF:
				defaults->SetDontLightSelf(gl_ParseInt(sc) != 0);
				break;
			default:
				sc.ScriptError("Unknown tag: %s\n", sc.String);
			}
		}
		gl_AddLightDefaults(defaults);
	}
	else
	{
		sc.ScriptError("Expected '{'.\n");
	}
}